

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8 lo,uint8 hi,bool foldcase,int next)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  undefined7 in_register_00000031;
  uint64 key;
  ulong local_38;
  
  uVar4 = CONCAT71(in_register_00000009,foldcase) & 0xffffffff;
  local_38 = uVar4 | ((ulong)(uint)((int)CONCAT71(in_register_00000031,lo) << 9) |
                     (long)next << 0x11) + (CONCAT71(in_register_00000011,hi) & 0xffffffff) * 2;
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::_Select1st<std::pair<const_unsigned_long,_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
          ::find(&(this->rune_cache_)._M_t,&local_38);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->rune_cache_)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = UncachedRuneByteSuffix(this,lo,hi,SUB81(uVar4,0),next);
    pmVar3 = std::
             map<unsigned_long,_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
             ::operator[](&this->rune_cache_,&local_38);
    *pmVar3 = iVar1;
  }
  else {
    iVar1 = *(int *)&iVar2._M_node[1]._M_parent;
  }
  return iVar1;
}

Assistant:

int Compiler::CachedRuneByteSuffix(uint8 lo, uint8 hi, bool foldcase,
                                   int next) {
  uint64 key = MakeRuneCacheKey(lo, hi, foldcase, next);
  map<uint64, int>::const_iterator it = rune_cache_.find(key);
  if (it != rune_cache_.end())
    return it->second;
  int id = UncachedRuneByteSuffix(lo, hi, foldcase, next);
  rune_cache_[key] = id;
  return id;
}